

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::Region3::mu0(Region3 *this,double T)

{
  double dVar1;
  pointer piVar2;
  size_t i;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = T / 647.096;
  dVar6 = 0.0;
  uVar3 = 0;
  while( true ) {
    piVar2 = (this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->muJ0).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar3) break;
    dVar1 = (this->mun0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
    dVar5 = powi(dVar4,piVar2[uVar3]);
    dVar6 = dVar6 + dVar1 / dVar5;
    uVar3 = uVar3 + 1;
  }
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  return (dVar4 * 100.0) / dVar6;
}

Assistant:

double mu0(double T) const{
            const double T_bar = T/Tcrit;
            double summer = 0.0;
            for (std::size_t i = 0; i < muJ0.size(); ++i)
            {
                summer += mun0[i]/powi(T_bar, muJ0[i]);
            }
            return 100.0*sqrt(T_bar)/summer;
        }